

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockVector::AddDetailedStatistics(VmaBlockVector *this,VmaDetailedStatistics *inoutStats)

{
  bool bVar1;
  ulong uVar2;
  VmaBlockMetadata *pVVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = this->m_hAllocator->m_UseMutex;
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  uVar2 = (this->m_Blocks).m_Count;
  if (uVar2 != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pVVar3 = (this->m_Blocks).m_pArray[uVar5]->m_pMetadata;
      (*pVVar3->_vptr_VmaBlockMetadata[0xe])(pVVar3,inoutStats);
      bVar4 = uVar6 < uVar2;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar4);
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
    return;
  }
  return;
}

Assistant:

void VmaBlockVector::AddDetailedStatistics(VmaDetailedStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);

    const size_t blockCount = m_Blocks.size();
    for (uint32_t blockIndex = 0; blockIndex < blockCount; ++blockIndex)
    {
        const VmaDeviceMemoryBlock* const pBlock = m_Blocks[blockIndex];
        VMA_ASSERT(pBlock);
        VMA_HEAVY_ASSERT(pBlock->Validate());
        pBlock->m_pMetadata->AddDetailedStatistics(inoutStats);
    }
}